

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSimpleConfigCase.cpp
# Opt level: O3

IterateResult __thiscall deqp::egl::SimpleConfigCase::iterate(SimpleConfigCase *this)

{
  void **ppvVar1;
  
  ppvVar1 = (this->m_configIter)._M_current;
  (this->m_configIter)._M_current = ppvVar1 + 1;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,this->m_display,*ppvVar1);
  return (uint)((this->m_configIter)._M_current !=
               (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
}

Assistant:

SimpleConfigCase::IterateResult SimpleConfigCase::iterate (void)
{
	DE_ASSERT(m_configIter != m_configs.end());

	EGLConfig	config	= *m_configIter++;

	try
	{
		executeForConfig(m_display, config);
	}
	catch (const tcu::TestError& e)
	{
		m_testCtx.getLog() << e;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	// \note Other errors are handled by framework (resource / internal errors).

	return (m_configIter != m_configs.end()) ? CONTINUE : STOP;
}